

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O1

void anon_unknown.dwarf_bd91::verifyPixelsAreEqual<Imath_3_2::half>
               (FlatImageChannel *c1,FlatImageChannel *c2,int dx,int dy)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ArgExc *this;
  int iVar9;
  int iVar10;
  
  lVar7 = __dynamic_cast(c1,&Imf_3_2::FlatImageChannel::typeinfo,
                         &Imf_3_2::TypedFlatImageChannel<Imath_3_2::half>::typeinfo,0);
  if (lVar7 != 0) {
    lVar8 = __dynamic_cast(c2,&Imf_3_2::FlatImageChannel::typeinfo,
                           &Imf_3_2::TypedFlatImageChannel<Imath_3_2::half>::typeinfo,0);
    if (lVar8 != 0) {
      lVar5 = *(long *)(c1 + 8);
      iVar6 = *(int *)(lVar5 + 0x1c);
      if (iVar6 <= *(int *)(lVar5 + 0x24)) {
        iVar3 = *(int *)(c1 + 0x10);
        iVar4 = *(int *)(c1 + 0x14);
        do {
          iVar9 = *(int *)(lVar5 + 0x18);
          if (iVar9 <= *(int *)(lVar5 + 0x20)) {
            do {
              Imf_3_2::ImageChannel::boundsCheck((int)lVar7,iVar9);
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)
                                        (*(long *)(lVar7 + 0x38) +
                                        (long)(iVar9 / *(int *)(lVar7 + 0x10) +
                                              (iVar6 / *(int *)(lVar7 + 0x14)) *
                                              *(int *)(lVar7 + 0x1c)) * 2) * 4);
              iVar10 = dx + iVar9;
              Imf_3_2::ImageChannel::boundsCheck((int)lVar8,iVar10);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)
                                        (*(long *)(lVar8 + 0x38) +
                                        (long)(iVar10 / *(int *)(lVar8 + 0x10) +
                                              ((dy + iVar6) / *(int *)(lVar8 + 0x14)) *
                                              *(int *)(lVar8 + 0x1c)) * 2) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                this = (ArgExc *)
                       __cxa_allocate_exception
                                 (0x48,*(long *)(lVar8 + 0x38),
                                  (long)iVar10 % (long)*(int *)(lVar8 + 0x10) & 0xffffffff);
                Iex_3_2::ArgExc::ArgExc(this,"different pixel values");
                __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
              }
              iVar9 = iVar9 + iVar3;
            } while (iVar9 <= *(int *)(lVar5 + 0x20));
          }
          iVar6 = iVar6 + iVar4;
        } while (iVar6 <= *(int *)(lVar5 + 0x24));
      }
      return;
    }
  }
  __cxa_bad_cast();
}

Assistant:

void
verifyPixelsAreEqual (
    const FlatImageChannel& c1, const FlatImageChannel& c2, int dx, int dy)
{
    const TypedFlatImageChannel<T>& tc1 =
        dynamic_cast<const TypedFlatImageChannel<T>&> (c1);

    const TypedFlatImageChannel<T>& tc2 =
        dynamic_cast<const TypedFlatImageChannel<T>&> (c2);

    const Box2i& dataWindow = c1.level ().dataWindow ();
    int          xStep      = c1.xSampling ();
    int          yStep      = c1.ySampling ();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; y += yStep)
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; x += xStep)
            if (tc1.at (x, y) != tc2.at (x + dx, y + dy))
                throw ArgExc ("different pixel values");
}